

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O1

void __thiscall SingleFileMuxer::~SingleFileMuxer(SingleFileMuxer *this)

{
  StreamInfo *this_00;
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  for (p_Var2 = (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this_00 = (StreamInfo *)p_Var2[1]._M_parent;
    if (this_00 != (StreamInfo *)0x0) {
      StreamInfo::~StreamInfo(this_00);
      operator_delete(this_00,0x88);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_SingleFileMuxer::StreamInfo_*>,_std::_Select1st<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
  ::~_Rb_tree(&(this->m_streamInfo)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->m_trackNameTmp)._M_t);
  (this->super_AbstractMuxer)._vptr_AbstractMuxer = (_func_int **)&PTR__AbstractMuxer_0023fae0;
  pcVar1 = (this->super_AbstractMuxer).m_origFileName._M_dataplus._M_p;
  paVar3 = &(this->super_AbstractMuxer).m_origFileName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar3) {
    return;
  }
  operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  return;
}

Assistant:

SingleFileMuxer::~SingleFileMuxer()
{
    for (const auto& itr : m_streamInfo) delete itr.second;
}